

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O1

REF_STATUS ref_cavity_create(REF_CAVITY *ref_cavity_ptr)

{
  uint uVar1;
  uint uVar2;
  REF_CAVITY pRVar3;
  REF_INT *pRVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  
  pRVar3 = (REF_CAVITY)malloc(0x78);
  *ref_cavity_ptr = pRVar3;
  if (pRVar3 == (REF_CAVITY)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x26,
           "ref_cavity_create","malloc *ref_cavity_ptr of REF_CAVITY_STRUCT NULL");
    uVar2 = 2;
  }
  else {
    pRVar3->state = REF_CAVITY_UNKNOWN;
    pRVar3->ref_grid = (REF_GRID)0x0;
    pRVar3->node = -1;
    pRVar3->surf_node = -1;
    pRVar3->nseg = 0;
    pRVar3->maxseg = 10;
    pRVar4 = (REF_INT *)malloc(0x78);
    pRVar3->s2n = pRVar4;
    if (pRVar4 == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x33
             ,"ref_cavity_create","malloc ref_cavity->s2n of REF_INT NULL");
    }
    else if (0 < pRVar3->maxseg) {
      uVar2 = pRVar3->maxseg * 3;
      uVar6 = 1;
      if (1 < (int)uVar2) {
        uVar6 = (ulong)uVar2;
      }
      memset(pRVar4,0,uVar6 << 2);
    }
    uVar2 = 2;
    if (pRVar4 != (REF_INT *)0x0) {
      iVar5 = pRVar3->maxseg;
      if (0 < iVar5) {
        pRVar4 = pRVar3->s2n + 1;
        lVar7 = 0;
        do {
          pRVar4[-1] = -1;
          lVar7 = lVar7 + 1;
          *pRVar4 = (REF_INT)lVar7;
          iVar5 = pRVar3->maxseg;
          pRVar4 = pRVar4 + 3;
        } while (lVar7 < iVar5);
      }
      pRVar3->s2n[iVar5 * 3 + -2] = -1;
      pRVar3->blankseg = 0;
      pRVar3->nface = 0;
      pRVar3->maxface = 10;
      pRVar4 = (REF_INT *)malloc(0x78);
      pRVar3->f2n = pRVar4;
      if (pRVar4 == (REF_INT *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x3f,"ref_cavity_create","malloc ref_cavity->f2n of REF_INT NULL");
      }
      else if (0 < pRVar3->maxface) {
        uVar1 = pRVar3->maxface * 3;
        uVar6 = 1;
        if (1 < (int)uVar1) {
          uVar6 = (ulong)uVar1;
        }
        memset(pRVar4,0,uVar6 << 2);
      }
      if (pRVar4 != (REF_INT *)0x0) {
        iVar5 = pRVar3->maxface;
        if (0 < iVar5) {
          pRVar4 = pRVar3->f2n + 1;
          lVar7 = 0;
          do {
            pRVar4[-1] = -1;
            lVar7 = lVar7 + 1;
            *pRVar4 = (REF_INT)lVar7;
            iVar5 = pRVar3->maxface;
            pRVar4 = pRVar4 + 3;
          } while (lVar7 < iVar5);
        }
        pRVar3->f2n[iVar5 * 3 + -2] = -1;
        pRVar3->blankface = 0;
        uVar2 = ref_list_create(&pRVar3->tri_list);
        if (uVar2 == 0) {
          uVar2 = ref_list_create(&pRVar3->tet_list);
          if (uVar2 == 0) {
            pRVar3->min_normdev = 0.5;
            pRVar3->split_node0 = -1;
            pRVar3->split_node1 = -1;
            pRVar3->collapse_node0 = -1;
            pRVar3->collapse_node1 = -1;
            pRVar3->seg_rm_adds_tet = 0;
            pRVar3->debug = 0;
            uVar2 = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x48,"ref_cavity_create",(ulong)uVar2,"tet list");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x47,"ref_cavity_create",(ulong)uVar2,"tri list");
        }
      }
    }
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_create(REF_CAVITY *ref_cavity_ptr) {
  REF_CAVITY ref_cavity;
  REF_INT seg, face;

  ref_malloc(*ref_cavity_ptr, 1, REF_CAVITY_STRUCT);
  ref_cavity = (*ref_cavity_ptr);

  ref_cavity_state(ref_cavity) = REF_CAVITY_UNKNOWN;

  ref_cavity_grid(ref_cavity) = (REF_GRID)NULL;
  ref_cavity_node(ref_cavity) = REF_EMPTY;
  ref_cavity_surf_node(ref_cavity) = REF_EMPTY;

  ref_cavity_nseg(ref_cavity) = 0;
  ref_cavity_maxseg(ref_cavity) = 10;

  ref_malloc_init(ref_cavity->s2n, ref_cavity_maxseg(ref_cavity) * 3, REF_INT,
                  0);
  for (seg = 0; seg < ref_cavity_maxseg(ref_cavity); seg++) {
    ref_cavity_s2n(ref_cavity, 0, seg) = REF_EMPTY;
    ref_cavity_s2n(ref_cavity, 1, seg) = seg + 1;
  }
  ref_cavity_s2n(ref_cavity, 1, ref_cavity_maxseg(ref_cavity) - 1) = REF_EMPTY;
  ref_cavity_blankseg(ref_cavity) = 0;

  ref_cavity_nface(ref_cavity) = 0;
  ref_cavity_maxface(ref_cavity) = 10;

  ref_malloc_init(ref_cavity->f2n, ref_cavity_maxface(ref_cavity) * 3, REF_INT,
                  0);
  for (face = 0; face < ref_cavity_maxface(ref_cavity); face++) {
    ref_cavity_f2n(ref_cavity, 0, face) = REF_EMPTY;
    ref_cavity_f2n(ref_cavity, 1, face) = face + 1;
  }
  ref_cavity_f2n(ref_cavity, 1, ref_cavity_maxface(ref_cavity) - 1) = REF_EMPTY;
  ref_cavity_blankface(ref_cavity) = 0;

  RSS(ref_list_create(&(ref_cavity->tri_list)), "tri list");
  RSS(ref_list_create(&(ref_cavity->tet_list)), "tet list");

  ref_cavity->min_normdev = 0.5;

  ref_cavity->split_node0 = REF_EMPTY;
  ref_cavity->split_node1 = REF_EMPTY;
  ref_cavity->collapse_node0 = REF_EMPTY;
  ref_cavity->collapse_node1 = REF_EMPTY;

  ref_cavity->seg_rm_adds_tet = REF_FALSE;

  ref_cavity->debug = REF_FALSE;

  return REF_SUCCESS;
}